

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::doPendingFunctors(EventLoop *this)

{
  pointer pfVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  pointer pfVar5;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_38;
  
  this->callingPendingFunctors_ = true;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  pfVar5 = (this->pendingFunctors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (this->pendingFunctors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->pendingFunctors_).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar5;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if (pfVar1 != pfVar5) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (*(long *)((long)&(pfVar5->super__Function_base)._M_manager + lVar4) == 0) {
        uVar2 = std::__throw_bad_function_call();
        std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                  (&local_38);
        _Unwind_Resume(uVar2);
      }
      (**(code **)((long)&pfVar5->_M_invoker + lVar4))
                ((long)&(pfVar5->super__Function_base)._M_functor + lVar4);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
      pfVar5 = local_38.
               super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this->callingPendingFunctors_ = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_38);
  return;
}

Assistant:

void EventLoop::doPendingFunctors(){
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;

    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFunctors_);
    }

    for (size_t i = 0; i < functors.size(); i++)
    {
        functors[i]();
    }
    callingPendingFunctors_ = false;
}